

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vs_wrapper.hpp
# Opt level: O3

void VSInterface::RegisterFilter<TMedian>(VSRegisterFunction registerFunc,VSPlugin *vsplugin)

{
  string local_d0;
  Filter local_b0;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  
  local_b0.in_vi.Format.IsFamilyYUV = true;
  local_b0.in_vi.Format.IsFamilyRGB = false;
  local_b0.in_vi.Format.IsFamilyYCC = false;
  local_b0.in_vi.Format.IsInteger = true;
  local_b0.in_vi.Format.IsFloat = false;
  local_b0.in_vi.Format.SSW = 0;
  local_b0.in_vi.Format.SSH = 0;
  local_b0.in_vi.Format.BitsPerSample = 8;
  local_b0.in_vi.Format.BytesPerSample = 1;
  local_b0.in_vi.Format.Planes = 3;
  local_b0.in_vi.FPSNum = 1;
  local_b0.in_vi.FPSDenom = 1;
  local_b0.in_vi.Width = 0;
  local_b0.in_vi.Height = 0;
  local_b0.in_vi.Frames = 0;
  local_b0.in_vi.Audio_SPS = 0;
  local_b0.in_vi.Audio_SType = 0;
  local_b0.in_vi.Audio_NSamples = 0;
  local_b0.in_vi.Audio_NChannels = 0;
  local_b0.in_vi.Field = 0;
  local_b0._vptr_Filter = (_func_int **)&PTR_VSName_001149c8;
  local_48 = 0x200000002;
  uStack_40 = 0x200000002;
  local_38 = 1;
  Filter::VSParams_abi_cxx11_(&local_d0,&local_b0);
  (*registerFunc)("TemporalMedian",local_d0._M_dataplus._M_p,Create<TMedian>,(void *)0x0,vsplugin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RegisterFilter(VSRegisterFunction registerFunc, VSPlugin* vsplugin) {
    FilterType filter;
    registerFunc(filter.VSName(), filter.VSParams().c_str(), Create<FilterType>, nullptr, vsplugin);
  }